

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

void __thiscall QHttpNetworkReply::ignoreSslErrors(QHttpNetworkReply *this,QList<QSslError> *errors)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x168));
  if (bVar2) {
    QHttpNetworkConnection::ignoreSslErrors(*(QHttpNetworkConnection **)(lVar1 + 0x170),errors,-1);
    return;
  }
  return;
}

Assistant:

void QHttpNetworkReply::ignoreSslErrors(const QList<QSslError> &errors)
{
    Q_D(QHttpNetworkReply);
    if (d->connection)
        d->connection->ignoreSslErrors(errors);
}